

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  char *__format;
  char c;
  int n;
  priority_queue<int,_std::less<int>_> pq;
  
  pq.mData = (int *)operator_new__(4);
  *pq.mData = 0;
  pq.mCap = 1;
  pq.mSize = 0;
LAB_00101279:
  while( true ) {
    __isoc99_scanf("%c",&c);
    if (c == 'a') break;
    if (c == 'd') {
      CP::priority_queue<int,_std::less<int>_>::pop(&pq);
    }
    else {
      if ((c == 'f') || (c == 'l')) break;
      if (c == 'q') {
        CP::priority_queue<int,_std::less<int>_>::~priority_queue(&pq);
        return 0;
      }
    }
  }
  __isoc99_scanf("%d",&n);
  if (c == 'l') {
    uVar2 = CP::priority_queue<int,_std::less<int>_>::find_level(&pq,n);
    uVar3 = (ulong)(uint)n;
    if (-1 < (int)uVar2) {
      printf("Found %d at level %d\n",uVar3,(ulong)uVar2);
      goto LAB_00101279;
    }
LAB_00101327:
    __format = "%d not found\n";
  }
  else {
    if (c != 'f') {
      if (c == 'a') {
        CP::priority_queue<int,_std::less<int>_>::push(&pq,&n);
      }
      goto LAB_00101279;
    }
    bVar1 = CP::priority_queue<int,_std::less<int>_>::find(&pq,n);
    uVar3 = (ulong)(uint)n;
    if (!bVar1) goto LAB_00101327;
    __format = "Found %d\n";
  }
  printf(__format,uVar3);
  goto LAB_00101279;
}

Assistant:

int main() {
  CP::priority_queue<int> pq;
  char c;
  scanf("%c", &c);
  while (c != 'q') {
    if (c == 'a' || c == 'f' || c == 'l') {
      // add data
      int n;
      scanf("%d", &n);
      if (c == 'a') {
        pq.push(n);
      } else if (c == 'f') {
        bool r = pq.find(n);
        if (r) {
          printf("Found %d\n",n);
        } else {
          printf("%d not found\n",n);
        }
      } else if (c == 'l') {
        int r = pq.find_level(n);
        if (r >= 0) {
          printf("Found %d at level %d\n",n,r);
        } else {
          printf("%d not found\n",n);
        }
      }
    } else if (c == 'd') {
       pq.pop();
    }
    scanf("%c", &c);
  }
  return 0;
}